

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::MatchLiteralNode::Print(MatchLiteralNode *this,DebugWriter *w,Char *litbuf)

{
  bool bVar1;
  CharCount j;
  uint uVar2;
  int i;
  int iVar3;
  
  DebugWriter::Print(w,L"MatchLiteral(");
  bVar1 = this->isEquivClass;
  for (iVar3 = 0; iVar3 != (uint)bVar1 + (uint)bVar1 * 2 + 1; iVar3 = iVar3 + 1) {
    if (iVar3 != 0) {
      DebugWriter::Print(w,L", ");
    }
    DebugWriter::Print(w,L"\"");
    for (uVar2 = 0; uVar2 < this->length; uVar2 = uVar2 + 1) {
      DebugWriter::PrintEscapedChar
                (w,litbuf[(uVar2 << (bVar1 * '\x02' & 0x1fU)) + iVar3 + this->offset]);
    }
    DebugWriter::Print(w,L"\"");
  }
  DebugWriter::PrintEOL(w,L")");
  Node::PrintAnnotations(&this->super_Node,w);
  return;
}

Assistant:

void MatchLiteralNode::Print(DebugWriter* w, const Char* litbuf) const
    {
        w->Print(_u("MatchLiteral("));
        int skip = isEquivClass ? CaseInsensitive::EquivClassSize : 1;
        for (int i = 0; i < skip; i++)
        {
            if (i > 0)
                w->Print(_u(", "));
            w->Print(_u("\""));
            for (CharCount j = 0; j < length; j++)
                w->PrintEscapedChar(litbuf[offset + j * skip + i]);
            w->Print(_u("\""));
        }
        w->PrintEOL(_u(")"));
        PrintAnnotations(w);
    }